

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void Catch::Colour::use(Code _colourCode)

{
  int iVar1;
  IConfig *in_RAX;
  IMutableContext *pIVar2;
  undefined **ppuVar3;
  Ptr<const_Catch::IConfig> local_18;
  
  if (use(Catch::Colour::Code)::impl != '\0') goto LAB_001360b6;
  local_18.m_p = in_RAX;
  iVar1 = __cxa_guard_acquire(&use(Catch::Colour::Code)::impl);
  if (iVar1 == 0) goto LAB_001360b6;
  pIVar2 = getCurrentMutableContext();
  (*(pIVar2->super_IContext)._vptr_IContext[6])(&local_18,pIVar2);
  if (local_18.m_p == (IConfig *)0x0) {
LAB_00136104:
    iVar1 = isatty(1);
    if (iVar1 != 0) goto LAB_00136110;
    anon_unknown_22::NoColourImpl::instance();
    ppuVar3 = (undefined **)&anon_unknown_22::NoColourImpl::instance::s_instance;
  }
  else {
    iVar1 = (*((local_18.m_p)->super_IShared).super_NonCopyable._vptr_NonCopyable[0x10])();
    if ((char)iVar1 == '\0') goto LAB_00136104;
LAB_00136110:
    ppuVar3 = &(anonymous_namespace)::PosixColourImpl::instance()::s_instance;
    if ((anonymous_namespace)::PosixColourImpl::instance()::s_instance == '\0') {
      iVar1 = __cxa_guard_acquire(&(anonymous_namespace)::PosixColourImpl::instance()::s_instance);
      if (iVar1 != 0) {
        __cxa_guard_release(&(anonymous_namespace)::PosixColourImpl::instance()::s_instance);
      }
    }
  }
  Ptr<const_Catch::IConfig>::~Ptr(&local_18);
  use::impl = (IColourImpl *)ppuVar3;
  __cxa_guard_release(&use(Catch::Colour::Code)::impl);
LAB_001360b6:
  (**(code **)(*(long *)use::impl + 0x10))(use::impl,_colourCode);
  return;
}

Assistant:

void Colour::use( Code _colourCode ) {
        static IColourImpl* impl = isDebuggerActive()
            ? NoColourImpl::instance()
            : platformColourInstance();
        impl->use( _colourCode );
    }